

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

int __thiscall nuraft::asio_rpc_listener::shutdown(asio_rpc_listener *this,int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  undefined8 this_00;
  lock_guard<std::mutex> guard;
  ptr<rpc_session> s;
  shared_ptr<nuraft::rpc_session> *entry;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  *__range2;
  lock_guard<std::mutex> guard_1;
  mutex_type *in_stack_ffffffffffffff98;
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffb0;
  __normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
  local_20;
  vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  *local_18;
  asio_rpc_listener *local_8;
  
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this,in_stack_ffffffffffffff98);
  local_18 = &this->active_sessions_;
  local_20._M_current =
       (shared_ptr<nuraft::rpc_session> *)
       std::
       vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
       ::begin((vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
                *)in_stack_ffffffffffffff98);
  std::
  vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  ::end((vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
         *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
                        *)this,(__normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
                                *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffff98 = (mutex_type *)&stack0xffffffffffffffc0;
    std::shared_ptr<nuraft::rpc_session>::shared_ptr
              ((shared_ptr<nuraft::rpc_session> *)this,
               (shared_ptr<nuraft::rpc_session> *)in_stack_ffffffffffffff98);
    std::__shared_ptr_access<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x28af72);
    rpc_session::stop((rpc_session *)this_00);
    std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_ffffffffffffffb0);
    std::shared_ptr<nuraft::rpc_session>::~shared_ptr((shared_ptr<nuraft::rpc_session> *)0x28af90);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  ::clear((vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
           *)0x28afd1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x28afdb);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this,in_stack_ffffffffffffff98);
  std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::reset
            (in_stack_ffffffffffffffb0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x28b006);
  return extraout_EAX;
}

Assistant:

virtual void shutdown() override {
        {
            auto_lock(session_lock_);
            for (auto& entry: active_sessions_) {
                ptr<rpc_session> s = entry;
                s->stop();
                s.reset();
            }
            active_sessions_.clear();
        }

        auto_lock(listener_lock_);
        handler_.reset();
    }